

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O0

void __thiscall
App<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
display_welcome(App<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this)

{
  ostream *poVar1;
  App<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\n888b     d888 8888888888 88888888888 8888888b.   .d88888b.            8888888888 Y88b   d88P  .d88888b.  8888888b.  888     888  .d8888b.\n8888b   d8888 888            888     888   Y88b d88P\" \"Y88b           888         Y88b d88P  d88P\" \"Y88b 888  \"Y88b 888     888 d88P  Y88b\n88888b.d88888 888            888     888    888 888     888           888          Y88o88P   888     888 888    888 888     888 Y88b.\n888Y88888P888 8888888        888     888   d88P 888     888           8888888       Y888P    888     888 888    888 888     888  \"Y888b.\n888 Y888P 888 888            888     8888888P\"  888     888           888           d888b    888     888 888    888 888     888     \"Y88b.\n888  Y8P  888 888            888     888 T88b   888     888           888          d88888b   888     888 888    888 888     888       \"888\n888   \"   888 888            888     888  T88b  Y88b. .d88P           888         d88P Y88b  Y88b. .d88P 888  .d88P Y88b. .d88P Y88b  d88P\n888       888 8888888888     888     888   T88b  \"Y88888P\"            8888888888 d88P   Y88b  \"Y88888P\"  8888888P\"   \"Y88888P\"   \"Y8888P\"\n\n                                                                                                                       @github.com/sar0603"
                          );
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void display_welcome() {
      std::cout << R"(
888b     d888 8888888888 88888888888 8888888b.   .d88888b.            8888888888 Y88b   d88P  .d88888b.  8888888b.  888     888  .d8888b.
8888b   d8888 888            888     888   Y88b d88P" "Y88b           888         Y88b d88P  d88P" "Y88b 888  "Y88b 888     888 d88P  Y88b
88888b.d88888 888            888     888    888 888     888           888          Y88o88P   888     888 888    888 888     888 Y88b.
888Y88888P888 8888888        888     888   d88P 888     888           8888888       Y888P    888     888 888    888 888     888  "Y888b.
888 Y888P 888 888            888     8888888P"  888     888           888           d888b    888     888 888    888 888     888     "Y88b.
888  Y8P  888 888            888     888 T88b   888     888           888          d88888b   888     888 888    888 888     888       "888
888   "   888 888            888     888  T88b  Y88b. .d88P           888         d88P Y88b  Y88b. .d88P 888  .d88P Y88b. .d88P Y88b  d88P
888       888 8888888888     888     888   T88b  "Y88888P"            8888888888 d88P   Y88b  "Y88888P"  8888888P"   "Y88888P"   "Y8888P"

                                                                                                                       @github.com/sar0603)"
                << '\n';
    }